

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::DiskSourceTree::~DiskSourceTree(DiskSourceTree *this)

{
  DiskSourceTree *this_local;
  
  (this->super_SourceTree)._vptr_SourceTree = (_func_int **)&PTR__DiskSourceTree_008ea2f8;
  std::__cxx11::string::~string((string *)&this->last_error_message_);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::~vector(&this->mappings_);
  SourceTree::~SourceTree(&this->super_SourceTree);
  return;
}

Assistant:

DiskSourceTree::~DiskSourceTree() {}